

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_option_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt,bool is_positional)

{
  ulong uVar1;
  size_t sVar2;
  undefined7 in_register_00000009;
  string *delim;
  int iVar3;
  ulong uVar4;
  int iVar5;
  float fVar6;
  anon_class_16_2_577437cb __f;
  string shortNames;
  string desc;
  string desc_1;
  string longNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string left;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vlongNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vshortNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  stringstream out;
  long local_1a8 [2];
  long lStack_198;
  uint auStack_190 [88];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
  if ((int)CONCAT71(in_register_00000009,is_positional) == 0) {
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])(&left,this,opt,0);
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xd])(&desc,this,opt);
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xe])(&desc_1,this,opt);
    detail::split(&names,&left,',');
    vshortNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    delim = (string *)&vlongNames;
    vlongNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vshortNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vshortNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vlongNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vlongNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __f.vlongNames =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)delim;
    __f.vshortNames = &vshortNames;
    ::std::
    for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_option(CLI::Option_const*,bool)const::_lambda(std::__cxx11::string_const&)_1_>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,__f);
    ::std::__cxx11::string::string((string *)&local_1d8,", ",(allocator *)&longNames);
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&shortNames,(detail *)&vshortNames,&local_1d8,delim);
    ::std::__cxx11::string::~string((string *)&local_1d8);
    ::std::__cxx11::string::string((string *)&local_1f8,", ",(allocator *)&local_290);
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&longNames,(detail *)&vlongNames,&local_1f8,delim);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    uVar1 = (this->super_FormatterBase).column_width_;
    fVar6 = (float)uVar1 / 3.0;
    fVar6 = ceilf(fVar6 + fVar6);
    iVar3 = (int)(uVar1 / 3);
    if (CONCAT44(shortNames._M_string_length._4_4_,(int)shortNames._M_string_length) == 0) {
      *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) = (long)iVar3;
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
      iVar5 = 0;
      ::std::operator<<((ostream *)local_1a8,"");
    }
    else {
      ::std::operator+(&local_290,"  ",&shortNames);
      ::std::__cxx11::string::operator=((string *)&shortNames,(string *)&local_290);
      ::std::__cxx11::string::~string((string *)&local_290);
      if ((longNames._M_string_length != 0) ||
         ((desc._M_string_length != 0 &&
          (::std::__cxx11::string::append((string *)&shortNames), longNames._M_string_length != 0)))
         ) {
        ::std::__cxx11::string::append((char *)&shortNames);
      }
      iVar5 = 0;
      if (iVar3 <= (int)shortNames._M_string_length) {
        ::std::__cxx11::string::append((char *)&shortNames);
        iVar5 = (int)shortNames._M_string_length - iVar3;
      }
      *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) = (long)iVar3;
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
      ::std::operator<<((ostream *)local_1a8,(string *)&shortNames);
    }
    iVar3 = (int)fVar6;
    if (iVar3 <= iVar5) {
      iVar5 = iVar3;
    }
    iVar3 = iVar3 - iVar5;
    if (longNames._M_string_length == 0) {
      *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) = (long)iVar3;
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
      ::std::operator<<((ostream *)local_1a8,"");
    }
    else {
      if (desc._M_string_length != 0) {
        ::std::__cxx11::string::append((string *)&longNames);
      }
      if (iVar3 <= (int)longNames._M_string_length) {
        ::std::__cxx11::string::append((char *)&longNames);
      }
      *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) = (long)iVar3;
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
      ::std::operator<<((ostream *)local_1a8,(string *)&longNames);
    }
    if (desc_1._M_string_length != 0) {
      ::std::__cxx11::stringbuf::str();
      uVar1 = (this->super_FormatterBase).column_width_;
      ::std::__cxx11::string::~string((string *)&local_290);
      if (uVar1 < local_290._M_string_length) {
        ::std::operator<<((ostream *)local_1a8,'\n');
      }
      sVar2 = (this->super_FormatterBase).right_column_width_;
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_290,(char)(this->super_FormatterBase).column_width_);
      detail::streamOutAsParagraph
                ((ostream *)local_1a8,&desc_1,sVar2,&local_290,local_290._M_string_length <= uVar1);
      ::std::__cxx11::string::~string((string *)&local_290);
    }
    ::std::__cxx11::string::~string((string *)&longNames);
    ::std::__cxx11::string::~string((string *)&shortNames);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vlongNames);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vshortNames);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&names);
  }
  else {
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])(&desc_1,this,opt,1);
    ::std::operator+(&desc,"  ",&desc_1);
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xd])(&shortNames,this,opt);
    ::std::operator+(&left,&desc,&shortNames);
    ::std::__cxx11::string::~string((string *)&shortNames);
    ::std::__cxx11::string::~string((string *)&desc);
    ::std::__cxx11::string::~string((string *)&desc_1);
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xe])(&desc,this,opt);
    *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) =
         (long)(int)(this->super_FormatterBase).column_width_;
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
    ::std::operator<<((ostream *)local_1a8,(string *)&left);
    if (desc._M_string_length == 0) goto LAB_00129a7f;
    uVar1 = (this->super_FormatterBase).column_width_;
    uVar4 = uVar1;
    if (uVar1 <= left._M_string_length) {
      ::std::operator<<((ostream *)local_1a8,'\n');
      uVar4 = (this->super_FormatterBase).column_width_;
    }
    sVar2 = (this->super_FormatterBase).right_column_width_;
    desc_1._M_dataplus._M_p = (pointer)&desc_1.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&desc_1,(char)uVar4);
    detail::streamOutAsParagraph
              ((ostream *)local_1a8,&desc,sVar2,&desc_1,left._M_string_length < uVar1);
  }
  ::std::__cxx11::string::~string((string *)&desc_1);
LAB_00129a7f:
  ::std::__cxx11::string::~string((string *)&desc);
  ::std::__cxx11::string::~string((string *)&left);
  ::std::operator<<((ostream *)local_1a8,'\n');
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option(const Option *opt, bool is_positional) const {
    std::stringstream out;
    if(is_positional) {
        const std::string left = "  " + make_option_name(opt, true) + make_option_opts(opt);
        const std::string desc = make_option_desc(opt);
        out << std::setw(static_cast<int>(column_width_)) << std::left << left;

        if(!desc.empty()) {
            bool skipFirstLinePrefix = true;
            if(left.length() >= column_width_) {
                out << '\n';
                skipFirstLinePrefix = false;
            }
            detail::streamOutAsParagraph(
                out, desc, right_column_width_, std::string(column_width_, ' '), skipFirstLinePrefix);
        }
    } else {
        const std::string namesCombined = make_option_name(opt, false);
        const std::string opts = make_option_opts(opt);
        const std::string desc = make_option_desc(opt);

        // Split all names at comma and sort them into short names and long names
        const auto names = detail::split(namesCombined, ',');
        std::vector<std::string> vshortNames;
        std::vector<std::string> vlongNames;
        std::for_each(names.begin(), names.end(), [&vshortNames, &vlongNames](const std::string &name) {
            if(name.find("--", 0) != std::string::npos)
                vlongNames.push_back(name);
            else
                vshortNames.push_back(name);
        });

        // Assemble short and long names
        std::string shortNames = detail::join(vshortNames, ", ");
        std::string longNames = detail::join(vlongNames, ", ");

        // Calculate setw sizes
        const auto shortNamesColumnWidth = static_cast<int>(column_width_ / 3);  // 33% left for short names
        const auto longNamesColumnWidth = static_cast<int>(std::ceil(
            static_cast<float>(column_width_) / 3.0f * 2.0f));  // 66% right for long names and options, ceil result
        int shortNamesOverSize = 0;

        // Print short names
        if(shortNames.length() > 0) {
            shortNames = "  " + shortNames;  // Indent
            if(longNames.length() == 0 && opts.length() > 0)
                shortNames += opts;  // Add opts if only short names and no long names
            if(longNames.length() > 0)
                shortNames += ",";
            if(static_cast<int>(shortNames.length()) >= shortNamesColumnWidth) {
                shortNames += " ";
                shortNamesOverSize = static_cast<int>(shortNames.length()) - shortNamesColumnWidth;
            }
            out << std::setw(shortNamesColumnWidth) << std::left << shortNames;
        } else {
            out << std::setw(shortNamesColumnWidth) << std::left << "";
        }

        // Adjust long name column width in case of short names column reaching into long names column
        shortNamesOverSize =
            (std::min)(shortNamesOverSize, longNamesColumnWidth);  // Prevent negative result with unsigned integers
        const auto adjustedLongNamesColumnWidth = longNamesColumnWidth - shortNamesOverSize;

        // Print long names
        if(longNames.length() > 0) {
            if(opts.length() > 0)
                longNames += opts;
            if(static_cast<int>(longNames.length()) >= adjustedLongNamesColumnWidth)
                longNames += " ";

            out << std::setw(adjustedLongNamesColumnWidth) << std::left << longNames;
        } else {
            out << std::setw(adjustedLongNamesColumnWidth) << std::left << "";
        }

        if(!desc.empty()) {
            bool skipFirstLinePrefix = true;
            if(out.str().length() > column_width_) {
                out << '\n';
                skipFirstLinePrefix = false;
            }
            detail::streamOutAsParagraph(
                out, desc, right_column_width_, std::string(column_width_, ' '), skipFirstLinePrefix);
        }
    }

    out << '\n';
    return out.str();
}